

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

FSerializer * Serialize(FSerializer *arc,char *key,FLinePortal *port,FLinePortal *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    pFVar2 = Serialize<line_t>(arc,"origin",(line_t_conflict **)port,(line_t_conflict **)0x0);
    pFVar2 = Serialize<line_t>(pFVar2,"destination",(line_t_conflict **)&port->mDestination,
                               (line_t_conflict **)0x0);
    pFVar2 = FSerializer::Array<double>
                       (pFVar2,"displacement",&(port->mDisplacement).X,(double *)0x0,2,true);
    pFVar2 = Serialize(pFVar2,"type",&port->mType,(uint8_t *)0x0);
    pFVar2 = Serialize(pFVar2,"flags",&port->mFlags,(uint8_t *)0x0);
    pFVar2 = Serialize(pFVar2,"defflags",&port->mDefFlags,(uint8_t *)0x0);
    pFVar2 = Serialize(pFVar2,"align",&port->mAlign,(uint8_t *)0x0);
    FSerializer::EndObject(pFVar2);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FLinePortal &port, FLinePortal *def)
{
	if (arc.BeginObject(key))
	{
		arc("origin", port.mOrigin)
			("destination", port.mDestination)
			("displacement", port.mDisplacement)
			("type", port.mType)
			("flags", port.mFlags)
			("defflags", port.mDefFlags)
			("align", port.mAlign)
			.EndObject();
	}
	return arc;
}